

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool ClipperLib::PointInPolygon(IntPoint *pt,OutPt *pp,bool UseFullInt64Range)

{
  long lVar1;
  bool bVar2;
  undefined7 in_register_00000011;
  OutPt *pOVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  Int128 local_60;
  Int128 local_50;
  Int128 local_40;
  
  if ((int)CONCAT71(in_register_00000011,UseFullInt64Range) == 0) {
    lVar5 = pt->Y;
    bVar4 = false;
    pOVar3 = pp;
    do {
      lVar6 = (pOVar3->pt).Y;
      if (((lVar6 <= lVar5) && (lVar5 < (pOVar3->prev->pt).Y)) ||
         ((lVar5 < lVar6 && ((pOVar3->prev->pt).Y <= lVar5)))) {
        lVar1 = (pOVar3->pt).X;
        bVar4 = (bool)(bVar4 ^ pt->X < (((pOVar3->prev->pt).X - lVar1) * (lVar5 - lVar6)) /
                                       ((pOVar3->prev->pt).Y - lVar6) + lVar1);
      }
      pOVar3 = pOVar3->next;
    } while (pOVar3 != pp);
  }
  else {
    bVar4 = false;
    pOVar3 = pp;
    do {
      lVar5 = (pOVar3->pt).Y;
      lVar6 = pt->Y;
      if (((lVar5 <= lVar6) && (lVar6 < (pOVar3->prev->pt).Y)) ||
         ((lVar6 < lVar5 && ((pOVar3->prev->pt).Y <= lVar6)))) {
        local_60.lo = (pOVar3->pt).X;
        lVar5 = pt->X - local_60.lo;
        lVar6 = lVar5 >> 0x3f;
        local_60.lo = (pOVar3->prev->pt).X - local_60.lo;
        local_60.hi = local_60.lo >> 0x3f;
        Int128::operator*(&local_40,&local_60);
        Int128::operator/(&local_50,&local_40);
        bVar2 = lVar6 < local_50.hi;
        if (lVar6 == local_50.hi) {
          bVar2 = lVar5 < local_50.lo;
        }
        bVar4 = (bool)(bVar4 ^ bVar2);
      }
      pOVar3 = pOVar3->next;
    } while (pOVar3 != pp);
  }
  return bVar4;
}

Assistant:

bool PointInPolygon(const IntPoint &pt, OutPt *pp, bool UseFullInt64Range)
{
  OutPt *pp2 = pp;
  bool result = false;
  if (UseFullInt64Range) {
    do
    {
      if ((((pp2->pt.Y <= pt.Y) && (pt.Y < pp2->prev->pt.Y)) ||
          ((pp2->prev->pt.Y <= pt.Y) && (pt.Y < pp2->pt.Y))) &&
          Int128(pt.X - pp2->pt.X) < (Int128(pp2->prev->pt.X - pp2->pt.X) *
          Int128(pt.Y - pp2->pt.Y)) / Int128(pp2->prev->pt.Y - pp2->pt.Y))
            result = !result;
      pp2 = pp2->next;
    }
    while (pp2 != pp);
  }
  else
  {
    do
    {
      if ((((pp2->pt.Y <= pt.Y) && (pt.Y < pp2->prev->pt.Y)) ||
        ((pp2->prev->pt.Y <= pt.Y) && (pt.Y < pp2->pt.Y))) &&
        (pt.X < (pp2->prev->pt.X - pp2->pt.X) * (pt.Y - pp2->pt.Y) /
        (pp2->prev->pt.Y - pp2->pt.Y) + pp2->pt.X )) result = !result;
      pp2 = pp2->next;
    }
    while (pp2 != pp);
  }
  return result;
}